

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O0

void __thiscall tcmalloc::PageHeap::RegisterSizeClass(PageHeap *this,Span *span,uint32_t sc)

{
  ulong local_28;
  Length i;
  uint32_t sc_local;
  Span *span_local;
  PageHeap *this_local;
  
  *(uint *)&span->field_0x28 = *(uint *)&span->field_0x28 & 0xff00ffff | (sc & 0xff) << 0x10;
  for (local_28 = 1; local_28 < span->length - 1; local_28 = local_28 + 1) {
    TCMalloc_PageMap2<35>::set(&this->pagemap_,span->start + local_28,span);
  }
  return;
}

Assistant:

void PageHeap::RegisterSizeClass(Span* span, uint32_t sc) {
  // Associate span object with all interior pages as well
  ASSERT(span->location == Span::IN_USE);
  ASSERT(GetDescriptor(span->start) == span);
  ASSERT(GetDescriptor(span->start+span->length-1) == span);
  span->sizeclass = sc;
  for (Length i = 1; i < span->length-1; i++) {
    pagemap_.set(span->start+i, span);
  }
}